

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

light_map_type * __thiscall
jessilib::app_parameters::values(light_map_type *__return_storage_ptr__,app_parameters *this)

{
  bool bVar1;
  reference __k;
  reference __k_00;
  mapped_type *pmVar2;
  __sv_type _Var3;
  size_t local_80;
  char8_t *local_78;
  value_type *key_value_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map_type *__range1_1;
  value_type *key_value;
  const_iterator __end1;
  const_iterator __begin1;
  light_map_type *__range1;
  app_parameters *this_local;
  light_map_type *result;
  
  std::
  unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  __end1 = std::
           unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
           ::begin(&this->m_env_values);
  key_value = (value_type *)
              std::
              unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
              ::end(&this->m_env_values);
  while (bVar1 = std::__detail::operator==
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_true>
                              *)&key_value), ((bVar1 ^ 0xffU) & 1) != 0) {
    __k = std::__detail::
          _Node_const_iterator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_false,_true>
          ::operator*(&__end1);
    pmVar2 = std::
             unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
             ::operator[](__return_storage_ptr__,&__k->first);
    pmVar2->_M_len = (__k->second)._M_len;
    pmVar2->_M_str = (__k->second)._M_str;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_false,_true>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
             ::begin(&this->m_arg_values);
  key_value_1 = (value_type *)
                std::
                unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>_>
                ::end(&this->m_arg_values);
  while (bVar1 = std::__detail::operator==
                           (&__end1_1.
                             super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
                              *)&key_value_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    __k_00 = std::__detail::
             _Node_const_iterator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_false,_true>
             ::operator*(&__end1_1);
    _Var3 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&__k_00->second);
    pmVar2 = std::
             unordered_map<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
             ::operator[](__return_storage_ptr__,&__k_00->first);
    local_80 = _Var3._M_len;
    pmVar2->_M_len = local_80;
    local_78 = _Var3._M_str;
    pmVar2->_M_str = local_78;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_false,_true>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

app_parameters::light_map_type app_parameters::values() const {
	app_parameters::light_map_type result;

	for (const auto& key_value : m_env_values) {
		result[key_value.first] = key_value.second;
	}

	for (const auto& key_value : m_arg_values) {
		result[key_value.first] = key_value.second;
	}

	return result;
}